

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_pool.cpp
# Opt level: O2

bool __thiscall
duckdb::BufferPool::AddToEvictionQueue
          (BufferPool *this,shared_ptr<duckdb::BlockHandle,_true> *handle)

{
  atomic<unsigned_long> *paVar1;
  __int_type _Var2;
  bool bVar3;
  type handle_00;
  EvictionQueue *this_00;
  BlockHandle *pBVar4;
  long lVar5;
  weak_ptr<duckdb::BlockHandle,_true> wStack_48;
  BufferEvictionNode local_38;
  
  handle_00 = shared_ptr<duckdb::BlockHandle,_true>::operator*(handle);
  this_00 = GetEvictionQueueForBlockHandle(this,handle_00);
  pBVar4 = shared_ptr<duckdb::BlockHandle,_true>::operator->(handle);
  LOCK();
  paVar1 = &pBVar4->eviction_seq_num;
  _Var2 = (paVar1->super___atomic_base<unsigned_long>)._M_i;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  if (this->track_eviction_timestamps == true) {
    pBVar4 = shared_ptr<duckdb::BlockHandle,_true>::operator->(handle);
    lVar5 = ::std::chrono::_V2::steady_clock::now();
    LOCK();
    (pBVar4->lru_timestamp_msec).super___atomic_base<long>._M_i = lVar5 / 1000000;
    UNLOCK();
  }
  if (_Var2 != 0) {
    LOCK();
    (this_00->total_dead_nodes).super___atomic_base<unsigned_long>._M_i =
         (this_00->total_dead_nodes).super___atomic_base<unsigned_long>._M_i + 1;
    UNLOCK();
  }
  ::std::__weak_ptr<duckdb::BlockHandle,(__gnu_cxx::_Lock_policy)2>::
  __weak_ptr<duckdb::BlockHandle,void>
            ((__weak_ptr<duckdb::BlockHandle,(__gnu_cxx::_Lock_policy)2> *)&wStack_48,
             (__shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2> *)handle);
  BufferEvictionNode::BufferEvictionNode(&local_38,&wStack_48,_Var2 + 1);
  bVar3 = EvictionQueue::AddToEvictionQueue(this_00,&local_38);
  ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            (&local_38.handle.internal.
              super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            (&wStack_48.internal.super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return bVar3;
}

Assistant:

bool BufferPool::AddToEvictionQueue(shared_ptr<BlockHandle> &handle) {
	auto &queue = GetEvictionQueueForBlockHandle(*handle);

	// The block handle is locked during this operation (Unpin),
	// or the block handle is still a local variable (ConvertToPersistent)
	D_ASSERT(handle->Readers() == 0);
	auto ts = handle->NextEvictionSequenceNumber();
	if (track_eviction_timestamps) {
		handle->SetLRUTimestamp(
		    std::chrono::time_point_cast<std::chrono::milliseconds>(std::chrono::steady_clock::now())
		        .time_since_epoch()
		        .count());
	}

	if (ts != 1) {
		// we add a newer version, i.e., we kill exactly one previous version
		queue.IncrementDeadNodes();
	}

	// Get the eviction queue for the block and add it
	return queue.AddToEvictionQueue(BufferEvictionNode(weak_ptr<BlockHandle>(handle), ts));
}